

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  uint uVar3;
  Message *pMVar4;
  char *str;
  RE *pRVar5;
  ostream *poVar6;
  int exit_code;
  long in_FS_OFFSET;
  bool matched;
  bool local_13a;
  bool success;
  bool status_ok_local;
  DeathTestImpl *this_local;
  char *local_128;
  char *local_120;
  Message local_118;
  Message buffer;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string error_message;
  
  error_message.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar1 = spawned(this);
  if (bVar1) {
    GetCapturedStderr_abi_cxx11_();
    local_13a = false;
    Message::Message(&local_118);
    pMVar4 = Message::operator<<(&local_118,(char (*) [13])"Death test: ");
    local_120 = statement(this);
    pMVar4 = Message::operator<<(pMVar4,&local_120);
    Message::operator<<(pMVar4,(char (*) [2])0x1eac02);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog((GTestLog *)((long)&this_local + 4),GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                         ,0x25b);
      poVar6 = GTestLog::GetStream((GTestLog *)((long)&this_local + 4));
      std::operator<<(poVar6,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog((GTestLog *)((long)&this_local + 4));
      break;
    case DIED:
      if (status_ok) {
        str = (char *)std::__cxx11::string::c_str();
        pRVar5 = regex(this);
        bVar1 = RE::PartialMatch(str,pRVar5);
        if (!bVar1) {
          pMVar4 = Message::operator<<(&local_118,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"  Expected: ");
          pRVar5 = regex(this);
          local_128 = RE::pattern(pRVar5);
          pMVar4 = Message::operator<<(pMVar4,&local_128);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x1eac02);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
          FormatDeathTestOutput(&local_b0,(string *)local_30);
          Message::operator<<(pMVar4,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        local_13a = bVar1;
      }
      else {
        pMVar4 = Message::operator<<(&local_118,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"            ");
        uVar3 = status(this);
        ExitSummary_abi_cxx11_(&local_d0,(internal *)(ulong)uVar3,exit_code);
        pMVar4 = Message::operator<<(pMVar4,&local_d0);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x1eac02);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
        FormatDeathTestOutput(&local_f0,(string *)local_30);
        Message::operator<<(pMVar4,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      break;
    case LIVED:
      pMVar4 = Message::operator<<(&local_118,(char (*) [28])"    Result: failed to die.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_50,(string *)local_30);
      Message::operator<<(pMVar4,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case RETURNED:
      pMVar4 = Message::operator<<(&local_118,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_90,(string *)local_30);
      Message::operator<<(pMVar4,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      break;
    case THREW:
      pMVar4 = Message::operator<<(&local_118,(char (*) [33])"    Result: threw an exception.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_70,(string *)local_30);
      Message::operator<<(pMVar4,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    Message::GetString_abi_cxx11_((string *)&buffer,&local_118);
    DeathTest::set_last_death_test_message((string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    this_local._3_1_ = local_13a;
    Message::~Message(&local_118);
    std::__cxx11::string::~string((string *)local_30);
  }
  else {
    this_local._3_1_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != error_message.field_2._8_8_) {
    __stack_chk_fail();
  }
  return (bool)(this_local._3_1_ & 1);
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
# if GTEST_USES_PCRE
        // PCRE regexes support embedded NULs.
        const bool matched = RE::PartialMatch(error_message, *regex());
# else
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
# endif  // GTEST_USES_PCRE
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}